

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

ON_aStringHeader * __thiscall ON_String::IncrementedHeader(ON_String *this)

{
  ON_aStringHeader *hdr;
  ON_String *this_local;
  
  if (this->m_s == (char *)0x0) {
    this_local = (ON_String *)0x0;
  }
  else {
    this_local = (ON_String *)(this->m_s + -0xc);
    if ((ON_aStringHeader *)this_local == pEmptyStringHeader) {
      this_local = (ON_String *)0x0;
    }
    else {
      std::__atomic_base<int>::operator++((__atomic_base<int> *)this_local);
    }
  }
  return (ON_aStringHeader *)this_local;
}

Assistant:

ON_aStringHeader* ON_String::IncrementedHeader() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (nullptr == hdr)
    return nullptr;
  
  hdr--;
  if (hdr == pEmptyStringHeader)
    return nullptr;

  //ON_AtomicIncrementInt32(&hdr->ref_count);
  ++hdr->ref_count;
  return hdr;
}